

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,SPIRConstant **vector_elements,
          uint32_t num_elements,bool specialized)

{
  uint local_40;
  uint local_3c;
  uint32_t i_1;
  uint32_t i;
  bool matrix;
  bool specialized_local;
  uint32_t num_elements_local;
  SPIRConstant **vector_elements_local;
  SPIRConstant *this_local;
  TypeID constant_type__local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_010d7de8;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  ConstantMatrix::ConstantMatrix(&this->m);
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  this->is_null_array_specialized_length = false;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::SmallVector
            (&this->subconstants);
  ::std::__cxx11::string::string((string *)&this->specialization_constant_macro_name);
  if (((*vector_elements)->m).c[0].vecsize < 2) {
    (this->m).c[0].vecsize = num_elements;
    (this->m).columns = 1;
    for (local_40 = 0; local_40 < num_elements; local_40 = local_40 + 1) {
      (this->m).c[0].r[local_40] = (vector_elements[local_40]->m).c[0].r[0];
      if ((vector_elements[local_40]->specialization & 1U) != 0) {
        (this->m).c[0].id[local_40].id = (vector_elements[local_40]->super_IVariant).self.id;
      }
    }
  }
  else {
    (this->m).columns = num_elements;
    for (local_3c = 0; local_3c < num_elements; local_3c = local_3c + 1) {
      memcpy((this->m).c + local_3c,&vector_elements[local_3c]->m,0x34);
      if ((vector_elements[local_3c]->specialization & 1U) != 0) {
        (this->m).id[local_3c].id = (vector_elements[local_3c]->super_IVariant).self.id;
      }
    }
  }
  return;
}

Assistant:

SPIRConstant(TypeID constant_type_, const SPIRConstant *const *vector_elements, uint32_t num_elements,
	             bool specialized)
	    : constant_type(constant_type_)
	    , specialization(specialized)
	{
		bool matrix = vector_elements[0]->m.c[0].vecsize > 1;

		if (matrix)
		{
			m.columns = num_elements;

			for (uint32_t i = 0; i < num_elements; i++)
			{
				m.c[i] = vector_elements[i]->m.c[0];
				if (vector_elements[i]->specialization)
					m.id[i] = vector_elements[i]->self;
			}
		}
		else
		{
			m.c[0].vecsize = num_elements;
			m.columns = 1;

			for (uint32_t i = 0; i < num_elements; i++)
			{
				m.c[0].r[i] = vector_elements[i]->m.c[0].r[0];
				if (vector_elements[i]->specialization)
					m.c[0].id[i] = vector_elements[i]->self;
			}
		}
	}